

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O1

string_t __thiscall
duckdb::MD5Operator::Operation<duckdb::string_t,duckdb::string_t>
          (MD5Operator *this,string_t input,Vector *result)

{
  ulong uVar1;
  char *out_digest;
  const_data_ptr_t input_00;
  string_t hash;
  MD5Context context;
  undefined1 local_98 [16];
  undefined8 local_88;
  const_data_ptr_t local_80;
  MD5Context local_78;
  
  local_98 = (undefined1  [16])
             StringVector::EmptyString(input.value._8_8_,(Vector *)0x20,(idx_t)input.value._8_8_);
  MD5Context::MD5Context(&local_78);
  input_00 = input.value._0_8_;
  if (((ulong)this & 0xffffffff) < 0xd) {
    input_00 = (const_data_ptr_t)((long)&local_88 + 4);
  }
  local_88 = this;
  local_80 = input.value._0_8_;
  MD5Context::MD5Update(&local_78,input_00,(ulong)this & 0xffffffff);
  out_digest = local_98 + 4;
  if (0xc < (uint)local_98._0_4_) {
    out_digest = (char *)local_98._8_8_;
  }
  MD5Context::FinishHex(&local_78,out_digest);
  uVar1 = (ulong)(uint)local_98._0_4_;
  if (uVar1 < 0xd) {
    switchD_01306cb1::default(local_98 + 4 + uVar1,0,0xc - uVar1);
  }
  else {
    local_98._4_4_ = *(undefined4 *)local_98._8_8_;
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_98;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto hash = StringVector::EmptyString(result, MD5Context::MD5_HASH_LENGTH_TEXT);
		MD5Context context;
		context.Add(input);
		context.FinishHex(hash.GetDataWriteable());
		hash.Finalize();
		return hash;
	}